

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O2

void anon_unknown.dwarf_c5842::testWriteCopyRead
               (int partNumber,int runCount,int randomReadCount,string *tempDir)

{
  float fVar1;
  undefined4 uVar2;
  _Alloc_hider _Var3;
  __type _Var4;
  bool bVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  ostream *poVar17;
  ulong __new_size;
  char *pcVar18;
  uint *puVar19;
  int *piVar20;
  long lVar21;
  Header *pHVar22;
  string *psVar23;
  Box<Imath_3_2::Vec2<int>_> *pBVar24;
  Box<Imath_3_2::Vec2<int>_> *pBVar25;
  float *pfVar26;
  float *pfVar27;
  ChannelList *this;
  ChannelList *pCVar28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar30;
  ulong uVar31;
  ulong uVar32;
  undefined4 in_register_00000014;
  int i;
  ulong uVar33;
  ulong uVar34;
  int yLevel_1;
  int iVar35;
  int yLevel;
  uint uVar36;
  long lVar37;
  ulong uVar38;
  DeepScanLineOutputPart part_1;
  Array2D<unsigned_int> sampleCount;
  Array2D<unsigned_int_*> deepUintData;
  Array2D<float> floatData;
  Array2D<Imath_3_2::half> halfData;
  MultiPartOutputFile file;
  int iStack_2f4;
  Array2D<float_*> deepFloatData;
  Array2D<Imath_3_2::half_*> deepHalfData;
  Array2D<unsigned_int> uintData;
  Header header;
  vector<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_> outputfiles;
  string srcFn;
  stringstream ss;
  undefined4 uStack_1d4;
  _Rb_tree_node_base local_1d0;
  size_t local_1b0;
  string cpyFn;
  
  poVar17 = std::operator<<((ostream *)&std::cout,"Testing file with ");
  poVar17 = (ostream *)std::ostream::operator<<(poVar17,partNumber);
  poVar17 = std::operator<<(poVar17," part(s).");
  std::endl<char,std::char_traits<char>>(poVar17);
  std::ostream::flush();
  std::operator+(&srcFn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_register_00000014,randomReadCount),
                 "imf_test_copy_multipart_source.exr");
  std::operator+(&cpyFn,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_register_00000014,randomReadCount),
                 "imf_test_copy_multipart_copy.exr");
  __new_size = (ulong)(uint)partNumber;
  if (partNumber < 1) {
    partNumber = 0;
  }
  if (runCount < 1) {
    runCount = 0;
  }
  iVar16 = 0;
  do {
    if (iVar16 == runCount) {
      std::__cxx11::string::~string((string *)&cpyFn);
      std::__cxx11::string::~string((string *)&srcFn);
      return;
    }
    halfData._sizeX = 0;
    halfData._sizeY = 0;
    halfData._data = (half *)0x0;
    floatData._sizeX = 0;
    floatData._sizeY = 0;
    floatData._data = (float *)0x0;
    uintData._sizeX = 0;
    uintData._sizeY = 0;
    uintData._data = (uint *)0x0;
    sampleCount._sizeX = 0;
    sampleCount._sizeY = 0;
    sampleCount._data = (uint *)0x0;
    deepHalfData._sizeX = 0;
    deepHalfData._sizeY = 0;
    deepHalfData._data = (half **)0x0;
    deepFloatData._sizeX = 0;
    deepFloatData._sizeY = 0;
    deepFloatData._data = (float **)0x0;
    deepUintData._sizeX = 0;
    deepUintData._sizeY = 0;
    deepUintData._data = (uint **)0x0;
    outputfiles.
    super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    outputfiles.
    super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    outputfiles.
    super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::pixelTypes,__new_size);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::partTypes,__new_size);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::levelModes,__new_size);
    poVar17 = std::operator<<((ostream *)&std::cout,"Generating headers and data");
    std::endl<char,std::char_traits<char>>(poVar17);
    std::ostream::flush();
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::clear
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               &(anonymous_namespace)::headers);
    iVar35 = 0;
    for (lVar21 = 0; (ulong)(uint)partNumber * 4 != lVar21; lVar21 = lVar21 + 4) {
      _ss = 0;
      Imf_3_4::Header::Header(&header,0xe9,0xf7,1.0,(Vec2 *)&ss,1.0,INCREASING_Y,ZIPS_COMPRESSION);
      iVar7 = random_int(3);
      uVar8 = random_int(4);
      *(int *)((anonymous_namespace)::pixelTypes + lVar21) = iVar7;
      *(uint *)((anonymous_namespace)::partTypes + lVar21) = uVar8;
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(&local_1d0._M_parent,iVar35);
      std::__cxx11::stringbuf::str();
      Imf_3_4::Header::setName((string *)&header);
      std::__cxx11::string::~string((string *)&file);
      if (iVar7 == 0) {
        pcVar18 = (char *)Imf_3_4::Header::channels();
        Imf_3_4::Channel::Channel((Channel *)&file,UINT,1,1,false);
        Imf_3_4::ChannelList::insert(pcVar18,(Channel *)"UINT");
      }
      else if (iVar7 == 1) {
        pcVar18 = (char *)Imf_3_4::Header::channels();
        Imf_3_4::Channel::Channel((Channel *)&file,FLOAT,1,1,false);
        Imf_3_4::ChannelList::insert(pcVar18,(Channel *)"FLOAT");
      }
      else if (iVar7 == 2) {
        pcVar18 = (char *)Imf_3_4::Header::channels();
        Imf_3_4::Channel::Channel((Channel *)&file,HALF,1,1,false);
        Imf_3_4::ChannelList::insert(pcVar18,(Channel *)"HALF");
      }
      switch(uVar8) {
      case 2:
      case 0:
        Imf_3_4::Header::setType((string *)&header);
        uVar36 = uVar8 & 0xfffffffd;
        break;
      case 3:
      case 1:
        Imf_3_4::Header::setType((string *)&header);
        uVar12 = uVar8 & 0xfffffffd;
LAB_00141c11:
        uVar36 = uVar12;
        iVar9 = random_int(0xe9);
        iVar10 = random_int(0xf7);
        iVar11 = random_int(3);
        _file = iVar9 + 1;
        iStack_2f4 = iVar10 + 1;
        *(int *)((anonymous_namespace)::levelModes + lVar21) = iVar11;
        Imf_3_4::Header::setTileDescription((TileDescription *)&header);
        break;
      default:
        uVar36 = uVar8 & 0xfffffffd;
        uVar12 = 1;
        if (uVar36 == 1) goto LAB_00141c11;
      }
      uVar12 = random_int(3);
      if (uVar36 == 0) {
        uVar12 = random_int(2);
      }
      puVar19 = (uint *)Imf_3_4::Header::lineOrder();
      if (2 < uVar12) {
        uVar12 = 3;
      }
      *puVar19 = uVar12;
      if (uVar36 == 0) {
        poVar17 = std::operator<<((ostream *)&std::cout,"pixelType = ");
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar7);
        poVar17 = std::operator<<(poVar17," partType = ");
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,uVar8);
        poVar17 = std::operator<<(poVar17," line order =");
        piVar20 = (int *)Imf_3_4::Header::lineOrder();
      }
      else {
        poVar17 = std::operator<<((ostream *)&std::cout,"pixelType = ");
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,iVar7);
        poVar17 = std::operator<<(poVar17," partType = ");
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,uVar8);
        poVar17 = std::operator<<(poVar17," tile order =");
        piVar20 = (int *)Imf_3_4::Header::lineOrder();
        poVar17 = (ostream *)std::ostream::operator<<(poVar17,*piVar20);
        poVar17 = std::operator<<(poVar17," levelMode = ");
        piVar20 = (int *)((anonymous_namespace)::levelModes + lVar21);
      }
      poVar17 = (ostream *)std::ostream::operator<<(poVar17,*piVar20);
      std::endl<char,std::char_traits<char>>(poVar17);
      std::ostream::flush();
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
                ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                 &(anonymous_namespace)::headers,&header);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      Imf_3_4::Header::~Header(&header);
      iVar35 = iVar35 + 1;
    }
    remove(srcFn._M_dataplus._M_p);
    _Var3 = srcFn._M_dataplus;
    lVar21 = DAT_001d1338;
    pHVar22 = (anonymous_namespace)::headers;
    iVar35 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
              (&file,_Var3._M_p,pHVar22,(int)((lVar21 - (long)pHVar22) / 0x38),false,iVar35);
    std::operator<<((ostream *)&std::cout,"Writing files ");
    std::ostream::flush();
    for (uVar32 = 0; uVar32 != (uint)partNumber; uVar32 = uVar32 + 1) {
      iVar35 = (int)uVar32;
      switch(*(undefined4 *)((anonymous_namespace)::partTypes + uVar32 * 4)) {
      case 0:
        Imf_3_4::OutputPart::OutputPart((OutputPart *)&header,&file,iVar35);
        local_1d0._M_color = _S_red;
        local_1d0._M_parent = (_Base_ptr)0x0;
        local_1d0._M_left = &local_1d0;
        local_1b0 = 0;
        local_1d0._M_right = local_1d0._M_left;
        fillPixels<unsigned_int>(&uintData,0xe9,0xf7);
        fillPixels<float>(&floatData,0xe9,0xf7);
        fillPixels<Imath_3_2::half>(&halfData,0xe9,0xf7);
        setOutputFrameBuffer
                  ((FrameBuffer *)&ss,*(int *)((anonymous_namespace)::pixelTypes + uVar32 * 4),
                   &uintData,&floatData,&halfData,0xe9);
        Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)&header);
        Imf_3_4::OutputPart::writePixels((int)&header);
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                     *)&ss);
        break;
      case 1:
        Imf_3_4::TiledOutputPart::TiledOutputPart((TiledOutputPart *)&header,&file,iVar35);
        iVar35 = Imf_3_4::TiledOutputPart::numXLevels();
        iVar7 = Imf_3_4::TiledOutputPart::numYLevels();
        iVar9 = 0;
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        if (iVar35 < 1) {
          iVar35 = 0;
        }
        for (; iVar9 != iVar35; iVar9 = iVar9 + 1) {
          for (iVar10 = 0; iVar7 != iVar10; iVar10 = iVar10 + 1) {
            cVar6 = Imf_3_4::TiledOutputPart::isValidLevel((int)&header,iVar9);
            if (cVar6 != '\0') {
              iVar11 = Imf_3_4::TiledOutputPart::levelWidth((int)&header);
              iVar13 = Imf_3_4::TiledOutputPart::levelHeight((int)&header);
              local_1d0._M_color = _S_red;
              local_1d0._M_parent = (_Base_ptr)0x0;
              local_1d0._M_left = &local_1d0;
              local_1b0 = 0;
              local_1d0._M_right = local_1d0._M_left;
              fillPixels<unsigned_int>(&uintData,iVar11,iVar13);
              fillPixels<float>(&floatData,iVar11,iVar13);
              fillPixels<Imath_3_2::half>(&halfData,iVar11,iVar13);
              setOutputFrameBuffer
                        ((FrameBuffer *)&ss,*(int *)((anonymous_namespace)::pixelTypes + uVar32 * 4)
                         ,&uintData,&floatData,&halfData,iVar11);
              Imf_3_4::TiledOutputPart::setFrameBuffer((FrameBuffer *)&header);
              iVar11 = Imf_3_4::TiledOutputPart::numXTiles((int)&header);
              iVar13 = Imf_3_4::TiledOutputPart::numYTiles((int)&header);
              Imf_3_4::TiledOutputPart::writeTiles((int)&header,0,iVar11 + -1,0,iVar13 + -1,iVar9);
              std::
              _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                           *)&ss);
            }
          }
        }
        break;
      case 2:
        Imf_3_4::DeepScanLineOutputPart::DeepScanLineOutputPart(&part_1,&file,iVar35);
        Imf_3_4::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&ss);
        Imf_3_4::Array2D<unsigned_int>::resizeErase(&sampleCount,0xf7,0xe9);
        uVar31 = 0;
        iVar35 = 1;
        puVar19 = sampleCount._data;
        for (lVar21 = 0; lVar21 != 0xf7; lVar21 = lVar21 + 1) {
          iVar9 = (int)uVar31;
          lVar37 = 0;
          iVar7 = iVar35;
          while( true ) {
            if (lVar37 == 0x3a4) break;
            *(int *)((long)puVar19 + lVar37) = iVar7 + (int)(uVar31 / 10) * -10;
            lVar37 = lVar37 + 4;
            iVar7 = iVar7 + 1;
            uVar31 = (ulong)((int)uVar31 + 1);
          }
          puVar19 = puVar19 + sampleCount._sizeY;
          iVar35 = iVar35 + 0xe9;
          uVar31 = (ulong)(iVar9 + 0xe9);
        }
        Imf_3_4::Slice::Slice
                  ((Slice *)&header,UINT,(char *)sampleCount._data,4,0x3a4,1,1,0.0,false,false);
        Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&ss);
        iVar35 = *(int *)((anonymous_namespace)::pixelTypes + uVar32 * 4);
        if (iVar35 == 0) {
          fillPixels<unsigned_int>(&sampleCount,&deepUintData,0xe9,0xf7);
          iVar35 = *(int *)((anonymous_namespace)::pixelTypes + uVar32 * 4);
        }
        if (iVar35 == 1) {
          fillPixels<float>(&sampleCount,&deepFloatData,0xe9,0xf7);
          iVar35 = *(int *)((anonymous_namespace)::pixelTypes + uVar32 * 4);
        }
        if (iVar35 == 2) {
          fillPixels<Imath_3_2::half>(&sampleCount,&deepHalfData,0xe9,0xf7);
          iVar35 = *(int *)((anonymous_namespace)::pixelTypes + uVar32 * 4);
        }
        setOutputDeepFrameBuffer
                  ((DeepFrameBuffer *)&ss,iVar35,&deepUintData,&deepFloatData,&deepHalfData,0xe9);
        Imf_3_4::DeepScanLineOutputPart::setFrameBuffer((DeepFrameBuffer *)&part_1);
        Imf_3_4::DeepScanLineOutputPart::writePixels((int)&part_1);
        releasePixels(*(int *)((anonymous_namespace)::pixelTypes + uVar32 * 4),&deepUintData,
                      &deepFloatData,&deepHalfData,0xe9,0xf7);
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                     *)&ss);
        break;
      case 3:
        Imf_3_4::DeepTiledOutputPart::DeepTiledOutputPart
                  ((DeepTiledOutputPart *)&part_1,&file,iVar35);
        iVar7 = Imf_3_4::DeepTiledOutputPart::numXLevels();
        iVar35 = Imf_3_4::DeepTiledOutputPart::numYLevels();
        iVar9 = 0;
        if (iVar35 < 1) {
          iVar35 = 0;
        }
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        for (; iVar9 != iVar7; iVar9 = iVar9 + 1) {
          for (iVar10 = 0; iVar10 != iVar35; iVar10 = iVar10 + 1) {
            cVar6 = Imf_3_4::DeepTiledOutputPart::isValidLevel((int)&part_1,iVar9);
            if (cVar6 != '\0') {
              uVar8 = Imf_3_4::DeepTiledOutputPart::levelWidth((int)&part_1);
              uVar12 = Imf_3_4::DeepTiledOutputPart::levelHeight((int)&part_1);
              Imf_3_4::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&ss);
              Imf_3_4::Array2D<unsigned_int>::resizeErase
                        (&sampleCount,(long)(int)uVar12,(long)(int)uVar8);
              uVar31 = 0;
              if (0 < (int)uVar8) {
                uVar31 = (ulong)uVar8;
              }
              uVar38 = (ulong)uVar12;
              if ((int)uVar12 < 1) {
                uVar38 = 0;
              }
              iVar11 = 0;
              lVar21 = 0;
              for (uVar34 = 0; uVar34 != uVar38; uVar34 = uVar34 + 1) {
                for (uVar33 = 0; uVar31 != uVar33; uVar33 = uVar33 + 1) {
                  *(int *)((long)sampleCount._data + uVar33 * 4 + sampleCount._sizeY * lVar21) =
                       (iVar11 + (int)uVar33) % 10 + 1;
                }
                lVar21 = lVar21 + 4;
                iVar11 = iVar11 + uVar8;
              }
              Imf_3_4::Slice::Slice
                        ((Slice *)&header,UINT,(char *)sampleCount._data,4,(long)(int)uVar8 << 2,1,1
                         ,0.0,false,false);
              Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&ss);
              iVar11 = *(int *)((anonymous_namespace)::pixelTypes + uVar32 * 4);
              if (iVar11 == 0) {
                fillPixels<unsigned_int>(&sampleCount,&deepUintData,uVar8,uVar12);
                iVar11 = *(int *)((anonymous_namespace)::pixelTypes + uVar32 * 4);
              }
              if (iVar11 == 1) {
                fillPixels<float>(&sampleCount,&deepFloatData,uVar8,uVar12);
                iVar11 = *(int *)((anonymous_namespace)::pixelTypes + uVar32 * 4);
              }
              if (iVar11 == 2) {
                fillPixels<Imath_3_2::half>(&sampleCount,&deepHalfData,uVar8,uVar12);
                iVar11 = *(int *)((anonymous_namespace)::pixelTypes + uVar32 * 4);
              }
              setOutputDeepFrameBuffer
                        ((DeepFrameBuffer *)&ss,iVar11,&deepUintData,&deepFloatData,&deepHalfData,
                         uVar8);
              Imf_3_4::DeepTiledOutputPart::setFrameBuffer((DeepFrameBuffer *)&part_1);
              iVar11 = Imf_3_4::DeepTiledOutputPart::numXTiles((int)&part_1);
              iVar13 = Imf_3_4::DeepTiledOutputPart::numYTiles((int)&part_1);
              Imf_3_4::DeepTiledOutputPart::writeTiles
                        ((int)&part_1,0,iVar11 + -1,0,iVar13 + -1,iVar9);
              releasePixels(*(int *)((anonymous_namespace)::pixelTypes + uVar32 * 4),&deepUintData,
                            &deepFloatData,&deepHalfData,uVar8,uVar12);
              std::
              _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                           *)&ss);
            }
          }
        }
      }
    }
    Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&file);
    std::_Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>::
    ~_Vector_base(&outputfiles.
                   super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>
                 );
    Imf_3_4::Array2D<unsigned_int_*>::~Array2D(&deepUintData);
    Imf_3_4::Array2D<float_*>::~Array2D(&deepFloatData);
    Imf_3_4::Array2D<Imath_3_2::half_*>::~Array2D(&deepHalfData);
    Imf_3_4::Array2D<unsigned_int>::~Array2D(&sampleCount);
    Imf_3_4::Array2D<unsigned_int>::~Array2D(&uintData);
    Imf_3_4::Array2D<float>::~Array2D(&floatData);
    Imf_3_4::Array2D<Imath_3_2::half>::~Array2D(&halfData);
    std::operator<<((ostream *)&std::cout,"copying ");
    std::ostream::flush();
    _Var3 = srcFn._M_dataplus;
    iVar35 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&ss,_Var3._M_p,iVar35,true);
    iVar35 = Imf_3_4::MultiPartInputFile::parts();
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&file,(long)iVar35,
               (allocator_type *)&header);
    lVar37 = 0;
    for (lVar21 = 0; iVar35 = Imf_3_4::MultiPartInputFile::parts(), _Var3 = cpyFn._M_dataplus,
        lVar21 < iVar35; lVar21 = lVar21 + 1) {
      pHVar22 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&ss);
      Imf_3_4::Header::operator=((Header *)(CONCAT44(iStack_2f4,_file) + lVar37),pHVar22);
      lVar37 = lVar37 + 0x38;
    }
    pHVar22 = (Header *)CONCAT44(iStack_2f4,_file);
    iVar35 = Imf_3_4::MultiPartInputFile::parts();
    iVar7 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
              ((MultiPartOutputFile *)&halfData,_Var3._M_p,pHVar22,iVar35,false,iVar7);
    for (iVar35 = 0; iVar7 = Imf_3_4::MultiPartInputFile::parts(), iVar35 < iVar7;
        iVar35 = iVar35 + 1) {
      Imf_3_4::MultiPartInputFile::header((int)&ss);
      psVar23 = (string *)Imf_3_4::Header::type_abi_cxx11_();
      std::__cxx11::string::string((string *)&header,psVar23);
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &header,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)Imf_3_4::DEEPSCANLINE_abi_cxx11_);
      if (_Var4) {
        Imf_3_4::DeepScanLineInputPart::DeepScanLineInputPart
                  ((DeepScanLineInputPart *)&floatData,(MultiPartInputFile *)&ss,iVar35);
        Imf_3_4::DeepScanLineOutputPart::DeepScanLineOutputPart
                  ((DeepScanLineOutputPart *)&uintData,(MultiPartOutputFile *)&halfData,iVar35);
        Imf_3_4::DeepScanLineOutputPart::copyPixels((DeepScanLineInputPart *)&uintData);
      }
      else {
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&header,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)Imf_3_4::DEEPTILE_abi_cxx11_);
        if (_Var4) {
          Imf_3_4::DeepTiledInputPart::DeepTiledInputPart
                    ((DeepTiledInputPart *)&floatData,(MultiPartInputFile *)&ss,iVar35);
          Imf_3_4::DeepTiledOutputPart::DeepTiledOutputPart
                    ((DeepTiledOutputPart *)&uintData,(MultiPartOutputFile *)&halfData,iVar35);
          Imf_3_4::DeepTiledOutputPart::copyPixels((DeepTiledInputPart *)&uintData);
        }
        else {
          _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&header,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)Imf_3_4::SCANLINEIMAGE_abi_cxx11_);
          if (_Var4) {
            Imf_3_4::InputPart::InputPart((InputPart *)&floatData,(MultiPartInputFile *)&ss,iVar35);
            Imf_3_4::OutputPart::OutputPart
                      ((OutputPart *)&uintData,(MultiPartOutputFile *)&halfData,iVar35);
            Imf_3_4::OutputPart::copyPixels((InputPart *)&uintData);
          }
          else {
            _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&header,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)Imf_3_4::TILEDIMAGE_abi_cxx11_);
            if (_Var4) {
              Imf_3_4::TiledInputPart::TiledInputPart
                        ((TiledInputPart *)&floatData,(MultiPartInputFile *)&ss,iVar35);
              Imf_3_4::TiledOutputPart::TiledOutputPart
                        ((TiledOutputPart *)&uintData,(MultiPartOutputFile *)&halfData,iVar35);
              Imf_3_4::TiledOutputPart::copyPixels((TiledInputPart *)&uintData);
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)&header);
    }
    Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)&halfData);
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&file);
    Imf_3_4::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&ss);
    remove(srcFn._M_dataplus._M_p);
    _Var3 = cpyFn._M_dataplus;
    halfData._sizeX = 0;
    halfData._sizeY = 0;
    halfData._data = (half *)0x0;
    floatData._sizeX = 0;
    floatData._sizeY = 0;
    floatData._data = (float *)0x0;
    uintData._sizeX = 0;
    uintData._sizeY = 0;
    uintData._data = (uint *)0x0;
    sampleCount._sizeX = 0;
    sampleCount._sizeY = 0;
    sampleCount._data = (uint *)0x0;
    deepHalfData._sizeX = 0;
    deepHalfData._sizeY = 0;
    deepHalfData._data = (half **)0x0;
    deepFloatData._sizeX = 0;
    deepFloatData._sizeY = 0;
    deepFloatData._data = (float **)0x0;
    deepUintData._sizeX = 0;
    deepUintData._sizeY = 0;
    deepUintData._data = (uint **)0x0;
    iVar35 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&file,_Var3._M_p,iVar35,true);
    lVar21 = 0;
    while (iVar35 = Imf_3_4::MultiPartInputFile::parts(), lVar21 < iVar35) {
      Imf_3_4::MultiPartInputFile::header((int)&file);
      pBVar24 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
      pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
      bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar24,pBVar25);
      if (!bVar5) {
        __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                      ,0x305,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pBVar24 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
      pBVar25 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
      bVar5 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar24,pBVar25);
      if (!bVar5) {
        __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                      ,0x306,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pfVar26 = (float *)Imf_3_4::Header::pixelAspectRatio();
      fVar1 = *pfVar26;
      pfVar26 = (float *)Imf_3_4::Header::pixelAspectRatio();
      if ((fVar1 != *pfVar26) || (NAN(fVar1) || NAN(*pfVar26))) {
        __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                      ,0x307,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pfVar26 = (float *)Imf_3_4::Header::screenWindowCenter();
      pfVar27 = (float *)Imf_3_4::Header::screenWindowCenter();
      if ((((*pfVar26 != *pfVar27) || (NAN(*pfVar26) || NAN(*pfVar27))) ||
          (pfVar26[1] != pfVar27[1])) || (NAN(pfVar26[1]) || NAN(pfVar27[1]))) {
        __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                      ,0x309,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pfVar26 = (float *)Imf_3_4::Header::screenWindowWidth();
      fVar1 = *pfVar26;
      pfVar26 = (float *)Imf_3_4::Header::screenWindowWidth();
      if ((fVar1 != *pfVar26) || (NAN(fVar1) || NAN(*pfVar26))) {
        __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                      ,0x30a,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      piVar20 = (int *)Imf_3_4::Header::lineOrder();
      iVar35 = *piVar20;
      piVar20 = (int *)Imf_3_4::Header::lineOrder();
      if (iVar35 != *piVar20) {
        __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                      ,0x30b,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      piVar20 = (int *)Imf_3_4::Header::compression();
      iVar35 = *piVar20;
      piVar20 = (int *)Imf_3_4::Header::compression();
      if (iVar35 != *piVar20) {
        __assert_fail("header.compression () == headers[i].compression ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                      ,0x30c,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      this = (ChannelList *)Imf_3_4::Header::channels();
      pCVar28 = (ChannelList *)Imf_3_4::Header::channels();
      cVar6 = Imf_3_4::ChannelList::operator==(this,pCVar28);
      if (cVar6 == '\0') {
        __assert_fail("header.channels () == headers[i].channels ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                      ,0x30d,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pbVar29 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_4::Header::name_abi_cxx11_();
      pbVar30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_4::Header::name_abi_cxx11_();
      _Var4 = std::operator==(pbVar29,pbVar30);
      if (!_Var4) {
        __assert_fail("header.name () == headers[i].name ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                      ,0x30e,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pbVar29 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_4::Header::type_abi_cxx11_();
      pbVar30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_4::Header::type_abi_cxx11_();
      _Var4 = std::operator==(pbVar29,pbVar30);
      lVar21 = lVar21 + 1;
      if (!_Var4) {
        __assert_fail("header.type () == headers[i].type ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                      ,0x30f,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
    }
    std::operator<<((ostream *)&std::cout,"Reading whole files ");
    std::ostream::flush();
    outputfiles.
    super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    outputfiles.
    super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    outputfiles.
    super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar32 = (DAT_001d1338 - (long)(anonymous_namespace)::headers) / 0x38;
    iVar35 = 0;
    while( true ) {
      _ss = iVar35;
      iVar7 = (int)uVar32;
      if (iVar7 <= iVar35) break;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&outputfiles,(value_type_conflict3 *)&ss);
      iVar35 = _ss + 1;
    }
    uVar38 = 0;
    uVar31 = uVar38;
    if (0 < iVar7) {
      uVar38 = uVar32 & 0xffffffff;
      uVar31 = uVar38;
    }
    while (iVar35 = (int)uVar38, uVar38 = (ulong)(iVar35 - 1), iVar35 != 0) {
      iVar35 = random_int(iVar7);
      iVar9 = random_int(iVar7);
      uVar2 = *(undefined4 *)
               ((long)outputfiles.
                      super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start + (long)iVar35 * 4);
      *(undefined4 *)
       ((long)outputfiles.
              super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>
              ._M_impl.super__Vector_impl_data._M_start + (long)iVar35 * 4) =
           *(undefined4 *)
            ((long)outputfiles.
                   super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>
                   ._M_impl.super__Vector_impl_data._M_start + (long)iVar9 * 4);
      *(undefined4 *)
       ((long)outputfiles.
              super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>
              ._M_impl.super__Vector_impl_data._M_start + (long)iVar9 * 4) = uVar2;
    }
    for (uVar32 = 0; uVar32 != uVar31; uVar32 = uVar32 + 1) {
      iVar35 = *(int *)((long)outputfiles.
                              super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar32 * 4);
      lVar21 = (long)iVar35;
      switch(*(undefined4 *)((anonymous_namespace)::partTypes + lVar21 * 4)) {
      case 0:
        local_1d0._M_color = _S_red;
        local_1d0._M_parent = (_Base_ptr)0x0;
        local_1d0._M_left = &local_1d0;
        local_1b0 = 0;
        local_1d0._M_right = local_1d0._M_left;
        setInputFrameBuffer((FrameBuffer *)&ss,
                            *(int *)((anonymous_namespace)::pixelTypes + lVar21 * 4),
                            (Array2D<unsigned_int> *)&halfData,&floatData,
                            (Array2D<Imath_3_2::half> *)&uintData,0xe9,0xf7);
        Imf_3_4::InputPart::InputPart((InputPart *)&header,(MultiPartInputFile *)&file,iVar35);
        Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&header);
        Imf_3_4::InputPart::readPixels((int)(InputPart *)&header,0);
        iVar35 = *(int *)((anonymous_namespace)::pixelTypes + lVar21 * 4);
        if (iVar35 == 0) {
          bVar5 = checkPixels<unsigned_int>((Array2D<unsigned_int> *)&halfData,0xe9,0xf7);
          if (!bVar5) {
            __assert_fail("checkPixels<unsigned int> ( uData, width, height)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                          ,0x340,"void (anonymous namespace)::readWholeFiles(const std::string &)");
          }
        }
        else if (iVar35 == 1) {
          bVar5 = checkPixels<float>(&floatData,0xe9,0xf7);
          if (!bVar5) {
            __assert_fail("checkPixels<float> (fData, width, height)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                          ,0x343,"void (anonymous namespace)::readWholeFiles(const std::string &)");
          }
        }
        else if ((iVar35 == 2) &&
                (bVar5 = checkPixels<Imath_3_2::half>
                                   ((Array2D<Imath_3_2::half> *)&uintData,0xe9,0xf7), !bVar5)) {
          __assert_fail("checkPixels<half> (hData, width, height)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                        ,0x346,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                     *)&ss);
        break;
      case 1:
        Imf_3_4::TiledInputPart::TiledInputPart
                  ((TiledInputPart *)&header,(MultiPartInputFile *)&file,iVar35);
        iVar7 = Imf_3_4::TiledInputPart::numXLevels();
        iVar35 = Imf_3_4::TiledInputPart::numYLevels();
        iVar9 = 0;
        if (iVar35 < 1) {
          iVar35 = 0;
        }
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        for (; iVar9 != iVar7; iVar9 = iVar9 + 1) {
          for (iVar10 = 0; iVar35 != iVar10; iVar10 = iVar10 + 1) {
            cVar6 = Imf_3_4::TiledInputPart::isValidLevel((int)&header,iVar9);
            if (cVar6 != '\0') {
              iVar13 = Imf_3_4::TiledInputPart::levelWidth((int)&header);
              iVar14 = Imf_3_4::TiledInputPart::levelHeight((int)&header);
              local_1d0._M_color = _S_red;
              local_1d0._M_parent = (_Base_ptr)0x0;
              local_1d0._M_left = &local_1d0;
              local_1b0 = 0;
              local_1d0._M_right = local_1d0._M_left;
              setInputFrameBuffer((FrameBuffer *)&ss,
                                  *(int *)((anonymous_namespace)::pixelTypes + lVar21 * 4),
                                  (Array2D<unsigned_int> *)&halfData,&floatData,
                                  (Array2D<Imath_3_2::half> *)&uintData,iVar13,iVar14);
              Imf_3_4::TiledInputPart::setFrameBuffer((FrameBuffer *)&header);
              iVar15 = (int)&header;
              iVar11 = Imf_3_4::TiledInputPart::numXTiles(iVar15);
              iVar15 = Imf_3_4::TiledInputPart::numYTiles(iVar15);
              Imf_3_4::TiledInputPart::readTiles((int)&header,0,iVar11 + -1,0,iVar15 + -1,iVar9);
              iVar11 = *(int *)((anonymous_namespace)::pixelTypes + lVar21 * 4);
              if (iVar11 == 0) {
                bVar5 = checkPixels<unsigned_int>((Array2D<unsigned_int> *)&halfData,iVar13,iVar14);
                if (!bVar5) {
                  __assert_fail("checkPixels<unsigned int> ( uData, w, h)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                                ,0x36f,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
              else if (iVar11 == 1) {
                bVar5 = checkPixels<float>(&floatData,iVar13,iVar14);
                if (!bVar5) {
                  __assert_fail("checkPixels<float> (fData, w, h)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                                ,0x372,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
              else if ((iVar11 == 2) &&
                      (bVar5 = checkPixels<Imath_3_2::half>
                                         ((Array2D<Imath_3_2::half> *)&uintData,iVar13,iVar14),
                      !bVar5)) {
                __assert_fail("checkPixels<half> (hData, w, h)",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                              ,0x375,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
              std::
              _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                           *)&ss);
            }
          }
        }
        break;
      case 2:
        Imf_3_4::DeepScanLineInputPart::DeepScanLineInputPart
                  ((DeepScanLineInputPart *)&part_1,(MultiPartInputFile *)&file,iVar35);
        Imf_3_4::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&ss);
        Imf_3_4::Array2D<unsigned_int>::resizeErase
                  ((Array2D<unsigned_int> *)&deepUintData,0xf7,0xe9);
        Imf_3_4::Slice::Slice
                  ((Slice *)&header,UINT,(char *)deepUintData._data,4,0x3a4,1,1,0.0,false,false);
        Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&ss);
        setInputDeepFrameBuffer
                  ((DeepFrameBuffer *)&ss,*(int *)((anonymous_namespace)::pixelTypes + lVar21 * 4),
                   (Array2D<unsigned_int_*> *)&sampleCount,(Array2D<float_*> *)&deepHalfData,
                   (Array2D<Imath_3_2::half_*> *)&deepFloatData,0xe9,0xf7);
        Imf_3_4::DeepScanLineInputPart::setFrameBuffer((DeepFrameBuffer *)&part_1);
        Imf_3_4::DeepScanLineInputPart::readPixelSampleCounts((int)&part_1,0);
        allocatePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar21 * 4),
                       (Array2D<unsigned_int> *)&deepUintData,
                       (Array2D<unsigned_int_*> *)&sampleCount,(Array2D<float_*> *)&deepHalfData,
                       (Array2D<Imath_3_2::half_*> *)&deepFloatData,0xe9,0xf7);
        Imf_3_4::DeepScanLineInputPart::readPixels((int)&part_1,0);
        iVar35 = *(int *)((anonymous_namespace)::pixelTypes + lVar21 * 4);
        if (iVar35 == 0) {
          bVar5 = checkPixels<unsigned_int>
                            ((Array2D<unsigned_int> *)&deepUintData,
                             (Array2D<unsigned_int_*> *)&sampleCount,0xe9,0xf7);
          if (!bVar5) {
            __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, width, height)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                          ,0x3a2,"void (anonymous namespace)::readWholeFiles(const std::string &)");
          }
        }
        else if (iVar35 == 1) {
          bVar5 = checkPixels<float>((Array2D<unsigned_int> *)&deepUintData,
                                     (Array2D<float_*> *)&deepHalfData,0xe9,0xf7);
          if (!bVar5) {
            __assert_fail("checkPixels<float> ( sampleCount, deepFData, width, height)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                          ,0x3a6,"void (anonymous namespace)::readWholeFiles(const std::string &)");
          }
        }
        else if ((iVar35 == 2) &&
                (bVar5 = checkPixels<Imath_3_2::half>
                                   ((Array2D<unsigned_int> *)&deepUintData,
                                    (Array2D<Imath_3_2::half_*> *)&deepFloatData,0xe9,0xf7), !bVar5)
                ) {
          __assert_fail("checkPixels<half> ( sampleCount, deepHData, width, height)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                        ,0x3aa,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        releasePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar21 * 4),
                      (Array2D<unsigned_int_*> *)&sampleCount,(Array2D<float_*> *)&deepHalfData,
                      (Array2D<Imath_3_2::half_*> *)&deepFloatData,0xe9,0xf7);
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                     *)&ss);
        break;
      case 3:
        Imf_3_4::DeepTiledInputPart::DeepTiledInputPart
                  ((DeepTiledInputPart *)&part_1,(MultiPartInputFile *)&file,iVar35);
        iVar7 = Imf_3_4::DeepTiledInputPart::numXLevels();
        iVar35 = Imf_3_4::DeepTiledInputPart::numYLevels();
        iVar9 = 0;
        if (iVar35 < 1) {
          iVar35 = 0;
        }
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        for (; iVar9 != iVar7; iVar9 = iVar9 + 1) {
          for (iVar10 = 0; iVar35 != iVar10; iVar10 = iVar10 + 1) {
            cVar6 = Imf_3_4::DeepTiledInputPart::isValidLevel((int)&part_1,iVar9);
            if (cVar6 != '\0') {
              iVar13 = Imf_3_4::DeepTiledInputPart::levelWidth((int)&part_1);
              iVar14 = Imf_3_4::DeepTiledInputPart::levelHeight((int)&part_1);
              Imf_3_4::DeepFrameBuffer::DeepFrameBuffer((DeepFrameBuffer *)&ss);
              Imf_3_4::Array2D<unsigned_int>::resizeErase
                        ((Array2D<unsigned_int> *)&deepUintData,(long)iVar14,(long)iVar13);
              Imf_3_4::Slice::Slice
                        ((Slice *)&header,UINT,(char *)deepUintData._data,4,(long)iVar13 << 2,1,1,
                         0.0,false,false);
              Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&ss);
              setInputDeepFrameBuffer
                        ((DeepFrameBuffer *)&ss,
                         *(int *)((anonymous_namespace)::pixelTypes + lVar21 * 4),
                         (Array2D<unsigned_int_*> *)&sampleCount,(Array2D<float_*> *)&deepHalfData,
                         (Array2D<Imath_3_2::half_*> *)&deepFloatData,iVar13,iVar14);
              Imf_3_4::DeepTiledInputPart::setFrameBuffer((DeepFrameBuffer *)&part_1);
              iVar11 = Imf_3_4::DeepTiledInputPart::numXTiles((int)&part_1);
              iVar15 = Imf_3_4::DeepTiledInputPart::numYTiles((int)&part_1);
              Imf_3_4::DeepTiledInputPart::readPixelSampleCounts
                        ((int)&part_1,0,iVar11 + -1,0,iVar15 + -1,iVar9);
              allocatePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar21 * 4),
                             (Array2D<unsigned_int> *)&deepUintData,
                             (Array2D<unsigned_int_*> *)&sampleCount,
                             (Array2D<float_*> *)&deepHalfData,
                             (Array2D<Imath_3_2::half_*> *)&deepFloatData,iVar13,iVar14);
              Imf_3_4::DeepTiledInputPart::readTiles((int)&part_1,0,iVar11 + -1,0,iVar15 + -1,iVar9)
              ;
              iVar11 = *(int *)((anonymous_namespace)::pixelTypes + lVar21 * 4);
              if (iVar11 == 0) {
                bVar5 = checkPixels<unsigned_int>
                                  ((Array2D<unsigned_int> *)&deepUintData,
                                   (Array2D<unsigned_int_*> *)&sampleCount,iVar13,iVar14);
                if (!bVar5) {
                  __assert_fail("checkPixels<unsigned int> ( sampleCount, deepUData, w, h)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                                ,0x3f7,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
              else if (iVar11 == 1) {
                bVar5 = checkPixels<float>((Array2D<unsigned_int> *)&deepUintData,
                                           (Array2D<float_*> *)&deepHalfData,iVar13,iVar14);
                if (!bVar5) {
                  __assert_fail("checkPixels<float> ( sampleCount, deepFData, w, h)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                                ,0x3fb,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
              else if ((iVar11 == 2) &&
                      (bVar5 = checkPixels<Imath_3_2::half>
                                         ((Array2D<unsigned_int> *)&deepUintData,
                                          (Array2D<Imath_3_2::half_*> *)&deepFloatData,iVar13,iVar14
                                         ), !bVar5)) {
                __assert_fail("checkPixels<half> ( sampleCount, deepHData, w, h)",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCopyMultiPartFile.cpp"
                              ,0x3ff,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
              releasePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar21 * 4),
                            (Array2D<unsigned_int_*> *)&sampleCount,
                            (Array2D<float_*> *)&deepHalfData,
                            (Array2D<Imath_3_2::half_*> *)&deepFloatData,iVar13,iVar14);
              std::
              _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                           *)&ss);
            }
          }
        }
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&outputfiles);
    Imf_3_4::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&file);
    Imf_3_4::Array2D<unsigned_int>::~Array2D((Array2D<unsigned_int> *)&deepUintData);
    Imf_3_4::Array2D<Imath_3_2::half_*>::~Array2D((Array2D<Imath_3_2::half_*> *)&deepFloatData);
    Imf_3_4::Array2D<float_*>::~Array2D((Array2D<float_*> *)&deepHalfData);
    Imf_3_4::Array2D<unsigned_int_*>::~Array2D((Array2D<unsigned_int_*> *)&sampleCount);
    Imf_3_4::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&uintData);
    Imf_3_4::Array2D<float>::~Array2D(&floatData);
    Imf_3_4::Array2D<unsigned_int>::~Array2D((Array2D<unsigned_int> *)&halfData);
    remove(cpyFn._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::ostream::flush();
    iVar16 = iVar16 + 1;
  } while( true );
}

Assistant:

void
testWriteCopyRead (
    int                partNumber,
    int                runCount,
    int                randomReadCount,
    const std::string& tempDir)
{
    cout << "Testing file with " << partNumber << " part(s)." << endl << flush;

    std::string srcFn = tempDir + "imf_test_copy_multipart_source.exr";
    std::string cpyFn = tempDir + "imf_test_copy_multipart_copy.exr";

    for (int i = 0; i < runCount; i++)
    {
        generateRandomFile (partNumber, srcFn);
        copyFile (srcFn, cpyFn);
        remove (srcFn.c_str ());
        readWholeFiles (cpyFn);
        remove (cpyFn.c_str ());

        cout << endl << flush;
    }
}